

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE *ilimit_w;
  BYTE **ppBVar1;
  ZSTD_Sequence *pZVar2;
  BYTE *pBVar3;
  U32 UVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_CDict *pZVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  undefined8 uVar9;
  BYTE *pBVar10;
  ulong uVar11;
  seqDef *psVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  BYTE *pBVar18;
  U32 UVar19;
  U32 UVar20;
  repcodes_t updatedRepcodes;
  ulong local_60;
  BYTE *litLimit_w;
  
  pBVar18 = (BYTE *)(blockSize + (long)src);
  pZVar7 = cctx->cdict;
  if (pZVar7 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict != (void *)0x0) {
      pZVar7 = (ZSTD_CDict *)&cctx->prefixDict;
      goto LAB_00f37a6a;
    }
    local_60 = 0;
  }
  else {
LAB_00f37a6a:
    local_60 = (ulong)(uint)pZVar7->dictContentSize;
  }
  UVar4 = seqPos->idx;
  pZVar8 = (cctx->blockState).prevCBlock;
  updatedRepcodes.rep[2] = pZVar8->rep[2];
  uVar9 = *(undefined8 *)pZVar8->rep;
  updatedRepcodes.rep[0] = (U32)uVar9;
  updatedRepcodes.rep[1] = (U32)((ulong)uVar9 >> 0x20);
  ilimit_w = pBVar18 + -0x20;
  for (UVar20 = UVar4; UVar19 = updatedRepcodes.rep[1], uVar17 = (ulong)UVar20, uVar17 < inSeqsSize;
      UVar20 = UVar20 + 1) {
    pZVar2 = inSeqs + uVar17;
    uVar5 = inSeqs[uVar17].matchLength;
    if (((ulong)uVar5 == 0) && (pZVar2->offset == 0)) break;
    uVar6 = pZVar2->litLength;
    uVar17 = (ulong)uVar6;
    if (externalRepSearch == ZSTD_ps_disable) {
      UVar19 = pZVar2->offset + 3;
    }
    else {
      UVar19 = ZSTD_finalizeOffBase(pZVar2->offset,updatedRepcodes.rep,(uint)(uVar17 == 0));
      ZSTD_updateRep(updatedRepcodes.rep,UVar19,(uint)(uVar17 == 0));
    }
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar11 = (ulong)(uVar5 + uVar6) + seqPos->posInSrc;
      seqPos->posInSrc = uVar11;
      uVar15 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar14 = local_60 + uVar11;
      if (uVar15 < uVar11) {
        uVar14 = uVar15;
      }
      if (uVar14 + 3 < (ulong)UVar19) {
        return 0xffffffffffffff95;
      }
      if (uVar5 < 4 - ((cctx->appliedParams).cParams.minMatch == 3 ||
                      (cctx->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0)) {
        return 0xffffffffffffff95;
      }
    }
    if ((cctx->seqStore).maxNbSeq <= (ulong)(UVar20 - seqPos->idx)) {
      return 0xffffffffffffff95;
    }
    pBVar10 = (cctx->seqStore).lit;
    if (ilimit_w < (BYTE *)((long)src + uVar17)) {
      ZSTD_safecopyLiterals(pBVar10,(BYTE *)src,(BYTE *)((long)src + uVar17),ilimit_w);
LAB_00f37bd4:
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar17;
      psVar12 = (cctx->seqStore).sequences;
      if (0xffff < uVar6) {
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
    }
    else {
      uVar9 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar10 = *src;
      *(undefined8 *)(pBVar10 + 8) = uVar9;
      if (0x10 < uVar6) {
        pBVar10 = (cctx->seqStore).lit;
        uVar9 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar10 + 0x18) = uVar9;
        if (0x10 < uVar17 - 0x10) {
          lVar16 = 0;
          do {
            uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x20) + 8);
            pBVar3 = pBVar10 + lVar16 + 0x20;
            *(undefined8 *)pBVar3 = *(undefined8 *)((long)src + lVar16 + 0x20);
            *(undefined8 *)(pBVar3 + 8) = uVar9;
            uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x30) + 8);
            *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)((long)src + lVar16 + 0x30);
            *(undefined8 *)(pBVar3 + 0x18) = uVar9;
            lVar16 = lVar16 + 0x20;
          } while (pBVar3 + 0x20 < pBVar10 + uVar17);
          goto LAB_00f37bd4;
        }
      }
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar17;
      psVar12 = (cctx->seqStore).sequences;
    }
    psVar12->litLength = (U16)uVar6;
    psVar12->offBase = UVar19;
    uVar17 = (ulong)uVar5 - 3;
    if (0xffff < uVar17) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar12 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)uVar17;
    (cctx->seqStore).sequences = psVar12 + 1;
    src = (void *)((long)src + (ulong)(uVar5 + uVar6));
  }
  if ((externalRepSearch != ZSTD_ps_disable) || (UVar20 == UVar4)) goto LAB_00f37d47;
  if (UVar20 - 1 < UVar4 + 2) {
    if (UVar20 == UVar4 + 2) goto LAB_00f37d1b;
    updatedRepcodes.rep[1] = updatedRepcodes.rep[0];
    updatedRepcodes.rep[2] = UVar19;
  }
  else {
    updatedRepcodes.rep[0] = inSeqs[UVar20 - 3].offset;
LAB_00f37d1b:
    updatedRepcodes.rep[1] = inSeqs[UVar20 - 2].offset;
    updatedRepcodes.rep[2] = updatedRepcodes.rep[0];
  }
  updatedRepcodes.rep[0] = inSeqs[UVar20 - 1].offset;
LAB_00f37d47:
  pZVar8 = (cctx->blockState).nextCBlock;
  pZVar8->rep[2] = updatedRepcodes.rep[2];
  *(ulong *)pZVar8->rep = CONCAT44(updatedRepcodes.rep[1],updatedRepcodes.rep[0]);
  uVar14 = (ulong)inSeqs[uVar17].litLength;
  if (uVar14 != 0) {
    switchD_00916250::default((cctx->seqStore).lit,src,uVar14);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar14;
    src = (void *)((long)src + (ulong)inSeqs[uVar17].litLength);
    seqPos->posInSrc = seqPos->posInSrc + (ulong)inSeqs[uVar17].litLength;
  }
  sVar13 = 0xffffffffffffff95;
  if ((BYTE *)src == pBVar18) {
    seqPos->idx = UVar20 + 1;
    sVar13 = 0;
  }
  return sVar13;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, ZSTD_hasExtSeqProd(&cctx->appliedParams)),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}